

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void proto2_unittest::TestNestedRequiredForeign::SharedDtor(MessageLite *self)

{
  TestNestedRequiredForeign *this;
  TestRequiredForeign *this_00;
  TestRequiredEnum *this_01;
  TestRequiredEnumNoMask *this_02;
  TestRequiredEnumMulti *this_03;
  TestRequiredNoMaskMulti *this_04;
  ulong uVar1;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (TestNestedRequiredForeign *)self[1]._internal_metadata_.ptr_;
    if (this != (TestNestedRequiredForeign *)0x0) {
      ~TestNestedRequiredForeign(this);
    }
    operator_delete(this,0x50);
    this_00 = (TestRequiredForeign *)self[2]._vptr_MessageLite;
    if (this_00 != (TestRequiredForeign *)0x0) {
      TestRequiredForeign::~TestRequiredForeign(this_00);
    }
    operator_delete(this_00,0x48);
    this_01 = (TestRequiredEnum *)self[2]._internal_metadata_.ptr_;
    if (this_01 != (TestRequiredEnum *)0x0) {
      TestRequiredEnum::~TestRequiredEnum(this_01);
    }
    operator_delete(this_01,0x20);
    this_02 = (TestRequiredEnumNoMask *)self[3]._vptr_MessageLite;
    if (this_02 != (TestRequiredEnumNoMask *)0x0) {
      TestRequiredEnumNoMask::~TestRequiredEnumNoMask(this_02);
    }
    operator_delete(this_02,0x20);
    this_03 = (TestRequiredEnumMulti *)self[3]._internal_metadata_.ptr_;
    if (this_03 != (TestRequiredEnumMulti *)0x0) {
      TestRequiredEnumMulti::~TestRequiredEnumMulti(this_03);
    }
    operator_delete(this_03,0x28);
    this_04 = (TestRequiredNoMaskMulti *)self[4]._vptr_MessageLite;
    if (this_04 != (TestRequiredNoMaskMulti *)0x0) {
      TestRequiredNoMaskMulti::~TestRequiredNoMaskMulti(this_04);
    }
    operator_delete(this_04,0x38);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest.pb.cc"
             ,0x4d79,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestNestedRequiredForeign::SharedDtor(MessageLite& self) {
  TestNestedRequiredForeign& this_ = static_cast<TestNestedRequiredForeign&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.child_;
  delete this_._impl_.payload_;
  delete this_._impl_.required_enum_;
  delete this_._impl_.required_enum_no_mask_;
  delete this_._impl_.required_enum_multi_;
  delete this_._impl_.required_no_mask_;
  this_._impl_.~Impl_();
}